

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectBlur.cpp
# Opt level: O2

void __thiscall Rml::FontEffectBlurInstancer::FontEffectBlurInstancer(FontEffectBlurInstancer *this)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_94;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  String local_90;
  String local_70;
  String local_50;
  String local_30;
  
  FontEffectInstancer::FontEffectInstancer(&this->super_FontEffectInstancer);
  (this->super_FontEffectInstancer)._vptr_FontEffectInstancer =
       (_func_int **)&PTR__FontEffectBlurInstancer_00398b28;
  this->id_width = Invalid;
  this->id_color = Invalid;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"width",&local_91);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"1px",&local_92);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_70,&local_90,true);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"length",&local_93);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_94);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_30,&local_50);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_width = PVar1;
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"color",&local_91);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"white",&local_92);
  pPVar2 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_70,&local_90,false);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"color",&local_93);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_94);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_30,&local_50);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  this->id_color = PVar1;
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"font-effect",(allocator<char> *)&local_30);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"width, color",(allocator<char> *)&local_50);
  FontEffectInstancer::RegisterShorthand
            (&this->super_FontEffectInstancer,&local_70,&local_90,FallThrough);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

FontEffectBlurInstancer::FontEffectBlurInstancer() : id_width(PropertyId::Invalid), id_color(PropertyId::Invalid)
{
	id_width = RegisterProperty("width", "1px", true).AddParser("length").GetId();
	id_color = RegisterProperty("color", "white", false).AddParser("color").GetId();
	RegisterShorthand("font-effect", "width, color", ShorthandType::FallThrough);
}